

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::posix_part_file::move_partfile(posix_part_file *this,string *path,error_code *ec)

{
  bool bVar1;
  int iVar2;
  char *in_R9;
  string_view lhs;
  string_view lhs_00;
  string_view rhs;
  string_view rhs_00;
  string old_path;
  string new_path;
  storage_error se;
  string local_78;
  string local_58;
  storage_error local_38;
  
  flush_metadata_impl(this,ec);
  if (ec->failed_ != false) {
    return;
  }
  if ((this->m_piece_map)._M_h._M_element_count != 0) {
    lhs._M_str = (char *)(this->m_name)._M_string_length;
    lhs._M_len = (size_t)(this->m_path)._M_dataplus._M_p;
    rhs._M_str = in_R9;
    rhs._M_len = (size_t)(this->m_name)._M_dataplus._M_p;
    combine_path_abi_cxx11_(&local_78,(libtorrent *)(this->m_path)._M_string_length,lhs,rhs);
    lhs_00._M_str = (char *)(this->m_name)._M_string_length;
    lhs_00._M_len = (size_t)(path->_M_dataplus)._M_p;
    rhs_00._M_str = in_R9;
    rhs_00._M_len = (size_t)(this->m_name)._M_dataplus._M_p;
    combine_path_abi_cxx11_(&local_58,(libtorrent *)path->_M_string_length,lhs_00,rhs_00);
    rename((libtorrent *)&local_78,(char *)&local_58,(char *)ec);
    local_38.ec.val_ = 2;
    local_38.ec.failed_ = true;
    local_38.ec._5_3_ = 0;
    local_38.ec.cat_ =
         &boost::system::detail::cat_holder<void>::generic_category_instance.super_error_category;
    iVar2 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
    if (((char)iVar2 != '\0') ||
       (iVar2 = (*(local_38.ec.cat_)->_vptr_error_category[3])
                          (local_38.ec.cat_,ec,local_38.ec._0_8_ & 0xffffffff), (char)iVar2 != '\0')
       ) {
      ec->val_ = 0;
      ec->failed_ = false;
      ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
    }
    bVar1 = true;
    if (ec->failed_ == true) {
      local_38.ec._0_8_ = local_38.ec._0_8_ & 0xffffff0000000000;
      local_38.ec.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      local_38._16_3_ = 0xffffff;
      local_38.operation = unknown;
      copy_file(&local_78,&local_58,&local_38);
      ec->val_ = local_38.ec.val_;
      ec->failed_ = local_38.ec.failed_;
      *(undefined3 *)&ec->field_0x5 = local_38.ec._5_3_;
      ec->cat_ = local_38.ec.cat_;
      if (ec->failed_ == false) {
        remove((libtorrent *)&local_78,(char *)ec);
      }
      else {
        bVar1 = false;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      return;
    }
  }
  ::std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

void posix_part_file::move_partfile(std::string const& path, error_code& ec)
	{
		flush_metadata_impl(ec);
		if (ec) return;

		if (!m_piece_map.empty())
		{
			std::string old_path = combine_path(m_path, m_name);
			std::string new_path = combine_path(path, m_name);

			rename(old_path, new_path, ec);
			if (ec == boost::system::errc::no_such_file_or_directory)
				ec.clear();

			if (ec)
			{
				storage_error se;
				aux::copy_file(old_path, new_path, se);
				ec = se.ec;
				if (ec) return;
				remove(old_path, ec);
			}
		}
		m_path = path;
	}